

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_prepare_pop(Parser *this)

{
  size_t *psVar1;
  size_t *psVar2;
  State *pSVar3;
  ulong uVar4;
  State *pSVar5;
  size_t sVar6;
  code *pcVar7;
  size_t sVar8;
  size_t sVar9;
  undefined8 uVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  bool bVar14;
  
  if ((this->m_stack).m_size < 2) {
    if ((s_error_flags & 1) != 0) {
      bVar14 = is_debugger_attached();
      if (bVar14) {
        pcVar7 = (code *)swi(3);
        (*pcVar7)();
        return;
      }
    }
    (*(code *)PTR_error_impl_0029b798)
              ("check failed: m_stack.size() > 1",0x20,(anonymous_namespace)::s_default_callbacks);
  }
  if ((this->m_stack).m_size == 0) {
    if ((s_error_flags & 1) != 0) {
      bVar14 = is_debugger_attached();
      if (bVar14) {
        pcVar7 = (code *)swi(3);
        (*pcVar7)();
        return;
      }
    }
    (*(code *)PTR_error_impl_0029b798)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
  }
  pSVar3 = (this->m_stack).m_stack;
  uVar4 = (this->m_stack).m_size;
  if (uVar4 < 2) {
    if ((s_error_flags & 1) != 0) {
      bVar14 = is_debugger_attached();
      if (bVar14) {
        pcVar7 = (code *)swi(3);
        (*pcVar7)();
        return;
      }
    }
    (*(code *)PTR_error_impl_0029b798)
              ("check failed: i < m_size",0x18,(anonymous_namespace)::s_default_callbacks);
  }
  pSVar5 = (this->m_stack).m_stack;
  sVar6 = (this->m_stack).m_size;
  pSVar5[sVar6 - 2].pos.name.len = pSVar3[uVar4 - 1].pos.name.len;
  sVar8 = pSVar3[uVar4 - 1].pos.super_LineCol.offset;
  sVar9 = pSVar3[uVar4 - 1].pos.super_LineCol.line;
  psVar1 = &pSVar3[uVar4 - 1].pos.super_LineCol.col;
  uVar10 = psVar1[1];
  psVar2 = &pSVar5[sVar6 - 2].pos.super_LineCol.col;
  *psVar2 = *psVar1;
  psVar2[1] = uVar10;
  pSVar5[sVar6 - 2].pos.super_LineCol.offset = sVar8;
  pSVar5[sVar6 - 2].pos.super_LineCol.line = sVar9;
  sVar8 = pSVar3[uVar4 - 1].line_contents.full.len;
  pcVar11 = pSVar3[uVar4 - 1].line_contents.stripped.str;
  sVar9 = pSVar3[uVar4 - 1].line_contents.stripped.len;
  pcVar12 = pSVar3[uVar4 - 1].line_contents.rem.str;
  sVar13 = pSVar3[uVar4 - 1].line_contents.rem.len;
  pSVar5[sVar6 - 2].line_contents.full.str = pSVar3[uVar4 - 1].line_contents.full.str;
  pSVar5[sVar6 - 2].line_contents.full.len = sVar8;
  pSVar5[sVar6 - 2].line_contents.stripped.str = pcVar11;
  pSVar5[sVar6 - 2].line_contents.stripped.len = sVar9;
  pSVar5[sVar6 - 2].line_contents.rem.str = pcVar12;
  pSVar5[sVar6 - 2].line_contents.rem.len = sVar13;
  pSVar5[sVar6 - 2].line_contents.indentation = pSVar3[uVar4 - 1].line_contents.indentation;
  sVar8 = pSVar3[uVar4 - 1].scalar.len;
  pSVar5[sVar6 - 2].scalar.str = pSVar3[uVar4 - 1].scalar.str;
  pSVar5[sVar6 - 2].scalar.len = sVar8;
  return;
}

Assistant:

void _prepare_pop()
    {
        RYML_ASSERT(m_stack.size() > 1);
        State const& curr = m_stack.top();
        State      & next = m_stack.top(1);
        next.pos = curr.pos;
        next.line_contents = curr.line_contents;
        next.scalar = curr.scalar;
    }